

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_50a29::RegexExpr<char>::~RegexExpr(RegexExpr<char> *this)

{
  RegexExpr<char> *this_local;
  
  ~RegexExpr(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

bool parse(Context &con) const
	{
		size_t length;
		if (regexMatch(con.position.it, con.finish, r, length))
		{
			con.consume(length);
			return true;
		}
		con.set_error_pos();
		return false;
	}